

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ContainsMatcher * Catch::Matchers::Contains(string *str,Choice caseSensitivity)

{
  CasedString *in_RDI;
  CasedString *in_stack_ffffffffffffffd8;
  ContainsMatcher *in_stack_ffffffffffffffe0;
  
  StdString::CasedString::CasedString(in_RDI,(string *)in_RDI,Yes);
  StdString::ContainsMatcher::ContainsMatcher(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  StdString::CasedString::~CasedString((CasedString *)0x12d0c1);
  return (ContainsMatcher *)in_RDI;
}

Assistant:

StdString::ContainsMatcher Contains( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::ContainsMatcher( StdString::CasedString( str, caseSensitivity) );
    }